

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

bool __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<16U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  node_vec_type *this_00;
  vector<unsigned_int> *this_01;
  vector<unsigned_int> *this_02;
  vector<unsigned_int> *this_03;
  uint *puVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar5;
  void *p;
  uint *puVar6;
  vec<16U,_float> *pvVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  uint i;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  vq_node *pvVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  vq_node root;
  vec<16U,_float> result;
  float local_e8 [16];
  ulong local_a8;
  float local_a0;
  vector<unsigned_int> local_98;
  undefined5 local_88;
  undefined3 uStack_83;
  undefined4 local_80;
  undefined1 local_7c;
  float afStack_70 [16];
  
  uVar4 = (this->m_training_vecs).m_size;
  if (uVar4 == 0) {
    return false;
  }
  this->m_quick = quick;
  local_98.m_p = (uint *)0x0;
  local_98.m_size = 0;
  local_98.m_capacity = 0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  local_e8[3] = 0.0;
  local_e8[4] = 0.0;
  local_e8[5] = 0.0;
  local_e8[6] = 0.0;
  local_e8[7] = 0.0;
  local_e8[8] = 0.0;
  local_e8[9] = 0.0;
  local_e8[10] = 0.0;
  local_e8[0xb] = 0.0;
  local_e8[0xc] = 0.0;
  local_e8[0xd] = 0.0;
  local_e8[0xe] = 0.0;
  local_e8[0xf] = 0.0;
  local_a8 = 0;
  local_88 = 0xffffffffff;
  uStack_83 = 0xffffff;
  local_80 = 0xffffffff;
  local_7c = 0;
  vector<unsigned_int>::reserve(&local_98,uVar4);
  if ((this->m_training_vecs).m_size == 0) {
    fVar26 = 0.0;
  }
  else {
    fVar26 = 0.0;
    lVar22 = 0;
    uVar19 = 0;
    do {
      ppVar5 = (this->m_training_vecs).m_p;
      uVar20 = ppVar5[uVar19].second;
      fVar27 = (float)uVar20;
      lVar18 = 0;
      do {
        pfVar2 = (float *)((long)(ppVar5->first).m_s + lVar18 * 4 + lVar22);
        fVar25 = pfVar2[1];
        fVar3 = pfVar2[2];
        fVar8 = pfVar2[3];
        afStack_70[lVar18] = *pfVar2 * fVar27;
        afStack_70[lVar18 + 1] = fVar25 * fVar27;
        afStack_70[lVar18 + 2] = fVar3 * fVar27;
        afStack_70[lVar18 + 3] = fVar8 * fVar27;
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x10);
      lVar18 = 0;
      do {
        fVar25 = afStack_70[lVar18 + 1];
        fVar3 = afStack_70[lVar18 + 2];
        fVar8 = afStack_70[lVar18 + 3];
        local_e8[lVar18] = local_e8[lVar18] + afStack_70[lVar18];
        local_e8[lVar18 + 1] = local_e8[lVar18 + 1] + fVar25;
        local_e8[lVar18 + 2] = local_e8[lVar18 + 2] + fVar3;
        local_e8[lVar18 + 3] = local_e8[lVar18 + 3] + fVar8;
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x10);
      local_a8 = local_a8 + uVar20;
      if (local_98.m_capacity <= local_98.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_98,local_98.m_size + 1,true,4,(object_mover)0x0,false)
        ;
      }
      local_98.m_p[local_98.m_size] = (uint)uVar19;
      local_98.m_size = local_98.m_size + 1;
      fVar25 = ppVar5[uVar19].first.m_s[0];
      fVar25 = fVar25 * fVar25;
      lVar18 = 1;
      do {
        fVar3 = *(float *)((long)(ppVar5->first).m_s + lVar18 * 4 + lVar22);
        fVar25 = fVar25 + fVar3 * fVar3;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      fVar26 = fVar26 + fVar25 * fVar27;
      uVar19 = uVar19 + 1;
      lVar22 = lVar22 + 0x44;
    } while (uVar19 < (this->m_training_vecs).m_size);
  }
  fVar27 = local_e8[0] * local_e8[0];
  lVar22 = 1;
  do {
    fVar27 = fVar27 + local_e8[lVar22] * local_e8[lVar22];
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x10);
  local_a0 = fVar26 - fVar27 / (float)local_a8;
  fVar26 = 1.0 / (float)local_a8;
  lVar22 = 0;
  do {
    local_e8[lVar22] = local_e8[lVar22] * fVar26;
    local_e8[lVar22 + 1] = local_e8[lVar22 + 1] * fVar26;
    local_e8[lVar22 + 2] = local_e8[lVar22 + 2] * fVar26;
    local_e8[lVar22 + 3] = local_e8[lVar22 + 3] * fVar26;
    lVar22 = lVar22 + 4;
  } while (lVar22 != 0x10);
  this_00 = &this->m_nodes;
  pvVar24 = (this->m_nodes).m_p;
  if (pvVar24 != (vq_node *)0x0) {
    uVar19 = (ulong)(this->m_nodes).m_size;
    if (uVar19 != 0) {
      lVar22 = 0;
      do {
        p = *(void **)((long)(&pvVar24->m_centroid + 1) + lVar22 + 0x10);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar22 = lVar22 + 0x70;
      } while (uVar19 * 0x70 - lVar22 != 0);
      pvVar24 = this_00->m_p;
    }
    crnlib_free(pvVar24);
    this_00->m_p = (vq_node *)0x0;
    (this->m_nodes).m_size = 0;
    (this->m_nodes).m_capacity = 0;
  }
  vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::reserve(this_00,max_size * 2 + 1);
  uVar20 = (this->m_nodes).m_size;
  if ((this->m_nodes).m_capacity <= uVar20) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this_00,uVar20 + 1,true,0x70,
               vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::object_mover,false);
    uVar20 = (this->m_nodes).m_size;
  }
  pvVar24 = this_00->m_p;
  lVar22 = 0;
  do {
    pvVar24[uVar20].m_centroid.m_s[lVar22] = local_e8[lVar22];
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x10);
  pvVar24[uVar20].m_variance = local_a0;
  pvVar24[uVar20].m_total_weight = local_a8;
  pvVar24[uVar20].m_vectors.m_p = (uint *)0x0;
  pvVar24[uVar20].m_vectors.m_size = 0;
  pvVar24[uVar20].m_vectors.m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&pvVar24[uVar20].m_vectors,local_98.m_size,false,4,
             (object_mover)0x0,false);
  pvVar24[uVar20].m_vectors.m_size = local_98.m_size;
  memcpy(pvVar24[uVar20].m_vectors.m_p,local_98.m_p,(local_98._8_8_ & 0xffffffff) << 2);
  pvVar24[uVar20].m_left = (int)local_88;
  pvVar24[uVar20].m_right = (int)(CONCAT35(uStack_83,local_88) >> 0x20);
  *(ulong *)((long)&pvVar24[uVar20].m_right + 1) = CONCAT17(local_7c,CONCAT43(local_80,uStack_83));
  puVar1 = &(this->m_nodes).m_size;
  *puVar1 = *puVar1 + 1;
  this_01 = &this->m_heap;
  uVar20 = max_size + 1;
  uVar21 = (this->m_heap).m_size;
  if (uVar21 != uVar20) {
    if (uVar21 <= uVar20) {
      if ((this->m_heap).m_capacity < uVar20) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_01,uVar20,uVar21 == max_size,4,(object_mover)0x0,false);
        uVar21 = (this->m_heap).m_size;
      }
      memset(this_01->m_p + uVar21,0,(ulong)(uVar20 - uVar21) << 2);
    }
    (this->m_heap).m_size = uVar20;
  }
  (this->m_heap).m_p[1] = 0;
  this->m_heap_size = 1;
  this->m_split_index = 0;
  this_02 = &this->m_left_children;
  vector<unsigned_int>::reserve(this_02,(this->m_training_vecs).m_size + 1);
  this_03 = &this->m_right_children;
  vector<unsigned_int>::reserve(this_03,(this->m_training_vecs).m_size + 1);
  uVar21 = 1;
  uVar20 = 0xffffffff;
  do {
    if ((max_size <= uVar21) || (uVar17 = this->m_heap_size, uVar17 == 0)) {
LAB_0013e9ce:
      pvVar7 = (this->m_codebook).m_p;
      if (pvVar7 != (vec<16U,_float> *)0x0) {
        crnlib_free(pvVar7);
        (this->m_codebook).m_p = (vec<16U,_float> *)0x0;
        (this->m_codebook).m_size = 0;
        (this->m_codebook).m_capacity = 0;
      }
      this->m_overall_variance = 0.0;
      uVar20 = (this->m_nodes).m_size;
      if (uVar20 != 0) {
        lVar22 = 0x68;
        uVar19 = 0;
        do {
          pvVar24 = this_00->m_p;
          if (*(int *)((long)(pvVar24->m_centroid).m_s + lVar22 + -8) == -1) {
            uVar20 = (this->m_codebook).m_size;
            *(uint *)((long)(pvVar24->m_centroid).m_s + lVar22) = uVar20;
            if ((this->m_codebook).m_capacity <= uVar20) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_codebook,uVar20 + 1,true,0x40,
                         (object_mover)0x0,false);
              uVar20 = (this->m_codebook).m_size;
            }
            pvVar7 = (this->m_codebook).m_p;
            uVar9 = *(undefined8 *)((long)(pvVar24->m_centroid).m_s + lVar22 + -0x68);
            uVar10 = *(undefined8 *)((long)(pvVar24->m_centroid).m_s + lVar22 + -0x60);
            uVar11 = *(undefined8 *)((long)(pvVar24->m_centroid).m_s + lVar22 + -0x58);
            uVar12 = *(undefined8 *)((long)(pvVar24->m_centroid).m_s + lVar22 + -0x50);
            uVar13 = *(undefined8 *)((long)(pvVar24->m_centroid).m_s + lVar22 + -0x48);
            uVar14 = *(undefined8 *)((long)(&pvVar24->m_centroid + -1) + lVar22);
            uVar15 = *(undefined8 *)((long)(pvVar24->m_centroid).m_s + lVar22 + -0x30);
            *(undefined8 *)(pvVar7[uVar20].m_s + 0xc) =
                 *(undefined8 *)((long)(pvVar24->m_centroid).m_s + lVar22 + -0x38);
            *(undefined8 *)(pvVar7[uVar20].m_s + 0xc + 2) = uVar15;
            *(undefined8 *)(pvVar7[uVar20].m_s + 8) = uVar13;
            *(undefined8 *)(pvVar7[uVar20].m_s + 8 + 2) = uVar14;
            *(undefined8 *)(pvVar7[uVar20].m_s + 4) = uVar11;
            *(undefined8 *)(pvVar7[uVar20].m_s + 4 + 2) = uVar12;
            *(undefined8 *)pvVar7[uVar20].m_s = uVar9;
            *(undefined8 *)(pvVar7[uVar20].m_s + 2) = uVar10;
            puVar1 = &(this->m_codebook).m_size;
            *puVar1 = *puVar1 + 1;
            this->m_overall_variance =
                 *(float *)((long)(pvVar24->m_centroid).m_s + lVar22 + -0x20) +
                 this->m_overall_variance;
            uVar20 = (this->m_nodes).m_size;
          }
          uVar19 = uVar19 + 1;
          lVar22 = lVar22 + 0x70;
        } while (uVar19 < uVar20);
      }
      if (this_01->m_p != (uint *)0x0) {
        crnlib_free(this_01->m_p);
        this_01->m_p = (uint *)0x0;
        (this->m_heap).m_size = 0;
        (this->m_heap).m_capacity = 0;
      }
      if (this_02->m_p != (uint *)0x0) {
        crnlib_free(this_02->m_p);
        this_02->m_p = (uint *)0x0;
        (this->m_left_children).m_size = 0;
        (this->m_left_children).m_capacity = 0;
      }
      bVar16 = true;
      if (this_03->m_p != (uint *)0x0) {
        crnlib_free(this_03->m_p);
        this_03->m_p = (uint *)0x0;
        (this->m_right_children).m_size = 0;
        (this->m_right_children).m_capacity = 0;
      }
      goto LAB_0013eaef;
    }
    uVar23 = uVar21 * 100 + (max_size >> 1) + 100;
    while( true ) {
      uVar21 = uVar21 + 1;
      puVar6 = (this->m_heap).m_p;
      uVar4 = puVar6[1];
      puVar6[1] = puVar6[uVar17];
      puVar1 = &this->m_heap_size;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 != 0) {
        down_heap(this,1);
      }
      split_node(this,uVar4);
      if (((uVar21 & 0x3f) == 0 && pProgress_callback != (progress_callback_func_ptr)0x0) &&
         (uVar17 = uVar23 / max_size, uVar17 != uVar20)) break;
      if (max_size <= uVar21) goto LAB_0013e9ce;
      uVar23 = uVar23 + 100;
      uVar17 = this->m_heap_size;
      if (uVar17 == 0) goto LAB_0013e9ce;
    }
    bVar16 = (*pProgress_callback)(uVar17,pProgress_data);
    uVar20 = uVar17;
  } while (bVar16);
  bVar16 = false;
LAB_0013eaef:
  if (local_98.m_p == (uint *)0x0) {
    return bVar16;
  }
  crnlib_free(local_98.m_p);
  return bVar16;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = nullptr, void* pProgress_data = nullptr, bool quick = false)
        {
            if (m_training_vecs.empty())
            {
                return false;
            }

            m_quick = quick;

            double ttsum = 0.0f;

            vq_node root;
            root.m_vectors.reserve(m_training_vecs.size());

            for (uint i = 0; i < m_training_vecs.size(); i++)
            {
                const VectorType& v = m_training_vecs[i].first;
                const uint weight = m_training_vecs[i].second;

                root.m_centroid += (v * (float)weight);
                root.m_total_weight += weight;
                root.m_vectors.push_back(i);

                ttsum += v.dot(v) * weight;
            }

            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

            root.m_centroid *= (1.0f / root.m_total_weight);

            m_nodes.clear();
            m_nodes.reserve(max_size * 2 + 1);

            m_nodes.push_back(root);

            m_heap.resize(max_size + 1);
            m_heap[1] = 0;
            m_heap_size = 1;

            m_split_index = 0;

            uint total_leaves = 1;

            m_left_children.reserve(m_training_vecs.size() + 1);
            m_right_children.reserve(m_training_vecs.size() + 1);

            int prev_percentage = -1;
            while ((total_leaves < max_size) && (m_heap_size))
            {
                int worst_node_index = m_heap[1];

                m_heap[1] = m_heap[m_heap_size];
                m_heap_size--;
                if (m_heap_size)
                {
                    down_heap(1);
                }

                split_node(worst_node_index);
                total_leaves++;

                if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size))
                {
                    int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
                    if (cur_percentage != prev_percentage)
                    {
                        if (!(*pProgress_callback)(cur_percentage, pProgress_data))
                        {
                            return false;
                        }

                        prev_percentage = cur_percentage;
                    }
                }
            }

            m_codebook.clear();

            m_overall_variance = 0.0f;

            for (uint i = 0; i < m_nodes.size(); i++)
            {
                vq_node& node = m_nodes[i];
                if (node.m_left != -1)
                {
                    CRNLIB_ASSERT(node.m_right != -1);
                    continue;
                }

                CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);

                m_overall_variance += node.m_variance;
            }

            m_heap.clear();
            m_left_children.clear();
            m_right_children.clear();

            return true;
        }